

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O1

void __thiscall
Js::ByteCodeWriter::Reg4(ByteCodeWriter *this,OpCode op,RegSlot R0,RegSlot R1,RegSlot R2,RegSlot R3)

{
  code *pcVar1;
  RegSlot RVar2;
  bool bVar3;
  RegSlot R1_00;
  RegSlot R2_00;
  RegSlot R3_00;
  undefined4 *puVar4;
  undefined6 in_register_00000032;
  RegSlot local_4c;
  RegSlot local_48;
  RegSlot local_44;
  RegSlot local_40;
  uint local_3c;
  RegSlot local_38;
  RegSlot local_34;
  
  local_34 = R3;
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)0x7);
  local_3c = (uint)CONCAT62(in_register_00000032,op);
  bVar3 = OpCodeAttr::HasMultiSizeLayout(op);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x204,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar3) goto LAB_0089b65e;
    *puVar4 = 0;
  }
  if (R0 != 0xffffffff) {
    if (this->m_functionWrite == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
      if (!bVar3) goto LAB_0089b65e;
      *puVar4 = 0;
    }
    local_38 = FunctionBody::MapRegSlot(this->m_functionWrite,R0);
    if (R1 != 0xffffffff) {
      if (this->m_functionWrite == (FunctionBody *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
        if (!bVar3) goto LAB_0089b65e;
        *puVar4 = 0;
      }
      R1_00 = FunctionBody::MapRegSlot(this->m_functionWrite,R1);
      RVar2 = local_34;
      if (R2 != 0xffffffff) {
        if (this->m_functionWrite == (FunctionBody *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar4 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                      ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
          if (!bVar3) goto LAB_0089b65e;
          *puVar4 = 0;
        }
        R2_00 = FunctionBody::MapRegSlot(this->m_functionWrite,R2);
        if (RVar2 != 0xffffffff) {
          if (this->m_functionWrite != (FunctionBody *)0x0) {
LAB_0089b575:
            R3_00 = FunctionBody::MapRegSlot(this->m_functionWrite,RVar2);
            RVar2 = local_38;
            local_34 = local_3c & 0xffff;
            bVar3 = TryWriteReg4<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                              (this,(OpCode)local_3c,local_38,R1_00,R2_00,R3_00);
            if (!bVar3) {
              bVar3 = TryWriteReg4<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                                (this,(OpCode)local_34,RVar2,R1_00,R2_00,R3_00);
              if (!bVar3) {
                local_4c = RVar2;
                local_48 = R1_00;
                local_44 = R2_00;
                local_40 = R3_00;
                Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,(OpCode)local_34,this);
                Data::Write(&this->m_byteCodeData,&local_4c,0x10);
              }
            }
            return;
          }
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar4 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                      ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
          if (bVar3) {
            *puVar4 = 0;
            goto LAB_0089b575;
          }
          goto LAB_0089b65e;
        }
      }
    }
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar4 = 1;
  bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                              ,0x146,"(registerID != Js::Constants::NoRegister)","bad register");
  if (bVar3) {
    *puVar4 = 0;
    Throw::InternalError();
  }
LAB_0089b65e:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void ByteCodeWriter::Reg4(OpCode op, RegSlot R0, RegSlot R1, RegSlot R2, RegSlot R3)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::Reg4);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        R0 = ConsumeReg(R0);
        R1 = ConsumeReg(R1);
        R2 = ConsumeReg(R2);
        R3 = ConsumeReg(R3);

        MULTISIZE_LAYOUT_WRITE(Reg4, op, R0, R1, R2, R3);
    }